

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.h
# Opt level: O0

Int64Vector * __thiscall CoreML::Specification::Imputer::mutable_imputedint64array(Imputer *this)

{
  bool bVar1;
  Int64Vector *this_00;
  Imputer *this_local;
  
  bVar1 = has_imputedint64array(this);
  if (!bVar1) {
    clear_ImputedValue(this);
    set_has_imputedint64array(this);
    this_00 = (Int64Vector *)operator_new(0x28);
    Int64Vector::Int64Vector(this_00);
    (this->ImputedValue_).imputedint64array_ = this_00;
  }
  return (Int64Vector *)(this->ImputedValue_).imputeddoublevalue_;
}

Assistant:

inline ::CoreML::Specification::Int64Vector* Imputer::mutable_imputedint64array() {
  if (!has_imputedint64array()) {
    clear_ImputedValue();
    set_has_imputedint64array();
    ImputedValue_.imputedint64array_ = new ::CoreML::Specification::Int64Vector;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Imputer.imputedInt64Array)
  return ImputedValue_.imputedint64array_;
}